

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prevector.h
# Opt level: O2

iterator __thiscall
prevector<8U,_int,_unsigned_int,_int>::insert
          (prevector<8U,_int,_unsigned_int,_int> *this,iterator pos,int *value)

{
  int *__src;
  uint uVar1;
  long lVar2;
  uint uVar3;
  prevector<8U,_int,_unsigned_int,_int> *ppVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  prevector<8U,_int,_unsigned_int,_int> *ppVar8;
  int iVar9;
  long in_FS_OFFSET;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  uVar1 = this->_size;
  uVar5 = uVar1 - 9;
  ppVar8 = (prevector<8U,_int,_unsigned_int,_int> *)(this->_union).indirect_contents.indirect;
  uVar7 = uVar5;
  if (uVar1 < 9) {
    uVar7 = uVar1;
  }
  uVar6 = 8;
  if (uVar1 >= 9) {
    uVar6 = (this->_union).indirect_contents.capacity;
  }
  uVar7 = uVar7 + 1;
  ppVar4 = ppVar8;
  uVar3 = uVar1;
  if (uVar6 < uVar7) {
    change_capacity(this,(uVar7 >> 1) + uVar7);
    uVar3 = this->_size;
    ppVar4 = (prevector<8U,_int,_unsigned_int,_int> *)(this->_union).indirect_contents.indirect;
    uVar5 = uVar3 - 9;
  }
  if (uVar1 < 9) {
    ppVar8 = this;
  }
  iVar9 = (int)((ulong)((long)pos.ptr - (long)ppVar8) >> 2);
  if (uVar3 < 9) {
    ppVar4 = this;
  }
  __src = (int *)((long)&ppVar4->_union + (long)iVar9 * 4);
  if (uVar3 < 9) {
    uVar5 = uVar3;
  }
  memmove((ppVar4->_union).direct + (long)iVar9 * 4 + 4,__src,(ulong)(uVar5 - iVar9) << 2);
  this->_size = this->_size + 1;
  *(int *)((ppVar4->_union).direct + (long)iVar9 * 4 + 4 + -4) = *value;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return (iterator)__src;
  }
  __stack_chk_fail();
}

Assistant:

iterator insert(iterator pos, const T& value) {
        size_type p = pos - begin();
        size_type new_size = size() + 1;
        if (capacity() < new_size) {
            change_capacity(new_size + (new_size >> 1));
        }
        T* ptr = item_ptr(p);
        T* dst = ptr + 1;
        memmove(dst, ptr, (size() - p) * sizeof(T));
        _size++;
        new(static_cast<void*>(ptr)) T(value);
        return iterator(ptr);
    }